

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O1

void IDASensPredict(IDAMem IDA_mem,N_Vector *yySens,N_Vector *ypSens)

{
  uint uVar1;
  sunrealtype *psVar2;
  undefined1 auVar3 [16];
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  long lVar7;
  
  auVar3 = _DAT_00134070;
  uVar1 = IDA_mem->ida_kk;
  if (-1 < (int)uVar1) {
    psVar2 = IDA_mem->ida_cvals;
    auVar5._0_8_ = (long)(int)uVar1;
    auVar5._8_4_ = uVar1;
    auVar5._12_4_ = (int)uVar1 >> 0x1f;
    lVar4 = 0;
    auVar5 = auVar5 ^ _DAT_00134070;
    auVar6 = _DAT_00134060;
    do {
      auVar8 = auVar6 ^ auVar3;
      if ((bool)(~(auVar8._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar8._0_4_ ||
                  auVar5._4_4_ < auVar8._4_4_) & 1)) {
        *(undefined8 *)((long)psVar2 + lVar4) = 0x3ff0000000000000;
      }
      if ((auVar8._12_4_ != auVar5._12_4_ || auVar8._8_4_ <= auVar5._8_4_) &&
          auVar8._12_4_ <= auVar5._12_4_) {
        *(undefined8 *)((long)psVar2 + lVar4 + 8) = 0x3ff0000000000000;
      }
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
      lVar4 = lVar4 + 0x10;
    } while ((ulong)(uVar1 >> 1 & 0x3fffffff) * 0x10 + 0x10 != lVar4);
  }
  N_VLinearCombinationVectorArray
            (IDA_mem->ida_Ns,uVar1 + 1,IDA_mem->ida_cvals,IDA_mem->ida_phiS,yySens);
  N_VLinearCombinationVectorArray
            (IDA_mem->ida_Ns,IDA_mem->ida_kk,IDA_mem->ida_gamma + 1,IDA_mem->ida_phiS + 1,ypSens);
  return;
}

Assistant:

static void IDASensPredict(IDAMem IDA_mem, N_Vector* yySens, N_Vector* ypSens)
{
  int j;

  for (j = 0; j <= IDA_mem->ida_kk; j++) { IDA_mem->ida_cvals[j] = ONE; }

  (void)N_VLinearCombinationVectorArray(IDA_mem->ida_Ns, IDA_mem->ida_kk + 1,
                                        IDA_mem->ida_cvals, IDA_mem->ida_phiS,
                                        yySens);

  (void)N_VLinearCombinationVectorArray(IDA_mem->ida_Ns, IDA_mem->ida_kk,
                                        IDA_mem->ida_gamma + 1,
                                        IDA_mem->ida_phiS + 1, ypSens);
}